

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdCofactoring(uint *pTruth,int nVars,int *pCofVars,int nLimit,int fVerbose)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *pTruth_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  Kit_DsdNtk_t **ppKVar10;
  Kit_DsdNtk_t *pKVar11;
  Kit_DsdNtk_t *pKVar12;
  Kit_DsdNtk_t *pNtk;
  ulong uVar13;
  uint *(*papuVar14) [16];
  uint nSize;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int local_604;
  int local_5f8;
  int local_5ec;
  uint local_5e8;
  uint *(*local_5d8) [16];
  Kit_DsdNtk_t *(*local_5a8) [16];
  int pTryVars [16];
  uint *ppCofs [5] [16];
  Kit_DsdNtk_t *ppNtks [5] [16];
  
  local_5a8 = ppNtks;
  iVar19 = 0;
  memset(local_5a8,0,0x280);
  if (4 < nLimit) {
    __assert_fail("nLimit < 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xa86,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  iVar7 = 0x50 << ((byte)(nVars + -5) & 0x1f);
  if (nVars < 6) {
    iVar7 = 0x50;
  }
  iVar8 = nVars + -5;
  if (nVars < 6) {
    iVar8 = iVar19;
  }
  ppCofs[0][0] = (uint *)malloc((long)iVar7 << 2);
  papuVar14 = ppCofs;
  for (lVar9 = 0; pTruth_00 = ppCofs[0][0], lVar9 != 5; lVar9 = lVar9 + 1) {
    for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
      (*papuVar14)[lVar15] = ppCofs[0][0] + (iVar19 + (int)lVar15 << ((byte)iVar8 & 0x1f));
    }
    papuVar14 = papuVar14 + 1;
    iVar19 = iVar19 + 0x10;
  }
  if (iVar19 != 0x50) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xa8f,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  Kit_TruthCopy(ppCofs[0][0],pTruth,nVars);
  ppNtks[0][0] = Kit_DsdDecompose(pTruth_00,nVars);
  if (fVerbose != 0) {
    printf("\nProcessing prime function with %d support variables:\n",(ulong)(uint)nVars);
  }
  uVar13 = 0;
  if (0 < nLimit) {
    uVar13 = (ulong)(uint)nLimit;
  }
  local_5d8 = ppCofs;
  ppKVar10 = ppNtks[1] + 1;
  uVar18 = 0;
  while (uVar20 = uVar13, uVar18 != uVar13) {
    nSize = 1 << ((byte)uVar18 & 0x1f);
    uVar4 = Kit_DsdCofactoringGetVars(ppNtks[uVar18],nSize,pTryVars);
    uVar20 = uVar18;
    if (uVar4 == 0) break;
    uVar20 = uVar18 + 1;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    local_5ec = 10000;
    local_604 = -1;
    local_5e8 = 10000;
    for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
      iVar19 = pTryVars[uVar16];
      uVar17 = 0;
      local_5f8 = 0;
      for (lVar9 = 0; (ulong)nSize * 8 != lVar9; lVar9 = lVar9 + 8) {
        puVar1 = *(uint **)((long)local_5d8[1] + lVar9 * 2);
        puVar2 = *(uint **)((long)*local_5d8 + lVar9);
        Kit_TruthCofactor0New(puVar1,puVar2,nVars,iVar19);
        puVar3 = *(uint **)((long)local_5d8[1] + lVar9 * 2 + 8);
        Kit_TruthCofactor1New(puVar3,puVar2,nVars,iVar19);
        pKVar11 = Kit_DsdDecompose(puVar1,nVars);
        *(Kit_DsdNtk_t **)((long)ppKVar10 + lVar9 * 2 + -8) = pKVar11;
        pKVar12 = Kit_DsdDecompose(puVar3,nVars);
        *(Kit_DsdNtk_t **)((long)ppKVar10 + lVar9 * 2) = pKVar12;
        uVar5 = Kit_DsdNonDsdSizeMax(pKVar11);
        if ((int)uVar5 < (int)uVar17) {
          uVar5 = uVar17;
        }
        uVar6 = Kit_DsdNonDsdSizeMax(pKVar12);
        uVar17 = uVar5;
        if (uVar5 <= uVar6) {
          uVar17 = uVar6;
        }
        iVar7 = Kit_TruthSupportSize(puVar1,nVars);
        iVar8 = Kit_TruthSupportSize(puVar3,nVars);
        local_5f8 = iVar8 + iVar7 + local_5f8;
        Kit_DsdNtkFree(pKVar11);
        Kit_DsdNtkFree(pKVar12);
      }
      if (((int)uVar17 < (int)local_5e8) || ((local_5e8 == uVar17 && (local_5f8 < local_5ec)))) {
        local_5ec = local_5f8;
        local_604 = iVar19;
        local_5e8 = uVar17;
      }
    }
    if (local_604 == -1) {
      __assert_fail("iVarBest != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0xac3,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
    }
    if (pCofVars != (int *)0x0) {
      pCofVars[uVar18] = local_604;
    }
    for (uVar18 = 0; nSize * 2 != uVar18; uVar18 = uVar18 + 2) {
      puVar1 = local_5d8[1][uVar18];
      puVar2 = *(uint **)((long)*local_5d8 + uVar18 * 4);
      Kit_TruthCofactor0New(puVar1,puVar2,nVars,local_604);
      puVar3 = local_5d8[1][uVar18 + 1];
      Kit_TruthCofactor1New(puVar3,puVar2,nVars,local_604);
      pKVar11 = Kit_DsdDecompose(puVar1,nVars);
      ppKVar10[uVar18 - 1] = pKVar11;
      pKVar12 = Kit_DsdDecompose(puVar3,nVars);
      ppKVar10[uVar18] = pKVar12;
      if (fVerbose != 0) {
        pNtk = Kit_DsdExpand(pKVar11);
        ppKVar10[uVar18 - 1] = pNtk;
        Kit_DsdNtkFree(pKVar11);
        pKVar11 = Kit_DsdExpand(pKVar12);
        ppKVar10[uVar18] = pKVar11;
        Kit_DsdNtkFree(pKVar12);
        printf("Cof%d%d: ",uVar20 & 0xffffffff,uVar18 & 0xffffffff);
        Kit_DsdPrint(_stdout,pNtk);
        putchar(10);
        printf("Cof%d%d: ",uVar20 & 0xffffffff,(ulong)((int)uVar18 + 1));
        Kit_DsdPrint(_stdout,pKVar11);
        putchar(10);
      }
    }
    local_5d8 = local_5d8 + 1;
    ppKVar10 = ppKVar10 + 0x10;
    uVar18 = uVar20;
  }
  for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
    for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
      if ((*local_5a8)[lVar15] != (Kit_DsdNtk_t *)0x0) {
        Kit_DsdNtkFree((*local_5a8)[lVar15]);
      }
    }
    local_5a8 = local_5a8 + 1;
  }
  free(pTruth_00);
  if (nLimit < (int)uVar20) {
    __assert_fail("nStep <= nLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xae4,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  return (int)uVar20;
}

Assistant:

int Kit_DsdCofactoring( unsigned * pTruth, int nVars, int * pCofVars, int nLimit, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[5][16] = {
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0}
    };
    Kit_DsdNtk_t * pTemp;
    unsigned * ppCofs[5][16];
    int pTryVars[16], nTryVars;
    int nPrimeSizeMin, nPrimeSizeMax, nPrimeSizeCur;
    int nSuppSizeMin, nSuppSizeMax, iVarBest;
    int i, k, v, nStep, nSize, nMemSize;
    assert( nLimit < 5 );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );
    ppNtks[0][0] = Kit_DsdDecompose( ppCofs[0][0], nVars );

    if ( fVerbose )
        printf( "\nProcessing prime function with %d support variables:\n", nVars );

    // perform recursive cofactoring
    for ( nStep = 0; nStep < nLimit; nStep++ )
    {
        nSize = (1 << nStep);
        // find the variables to use in the cofactoring step
        nTryVars = Kit_DsdCofactoringGetVars( ppNtks[nStep], nSize, pTryVars );
        if ( nTryVars == 0 )
            break;
        // cofactor w.r.t. the above variables
        iVarBest = -1;
        nPrimeSizeMin = 10000;
        nSuppSizeMin  = 10000;
        for ( v = 0; v < nTryVars; v++ )
        {
            nPrimeSizeMax = 0;
            nSuppSizeMax = 0;
            for ( i = 0; i < nSize; i++ )
            {
                // cofactor and decompose cofactors          
                Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, pTryVars[v] );
                Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, pTryVars[v] );
                ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
                ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
                // compute the largest non-decomp block
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+0]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+1]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                // compute the sum total of supports
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+0], nVars );
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+1], nVars );
                // free the networks
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+1] );
            }
            // find the min max support size of the prime component
            if ( nPrimeSizeMin > nPrimeSizeMax || (nPrimeSizeMin == nPrimeSizeMax && nSuppSizeMin > nSuppSizeMax) )
            {
                nPrimeSizeMin = nPrimeSizeMax;
                nSuppSizeMin  = nSuppSizeMax;
                iVarBest      = pTryVars[v];
            }
        }
        assert( iVarBest != -1 );
        // save the variable
        if ( pCofVars )
            pCofVars[nStep] = iVarBest;
        // cofactor w.r.t. the best
        for ( i = 0; i < nSize; i++ )
        {
            Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, iVarBest );
            Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, iVarBest );
            ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
            ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
            if ( fVerbose )
            {
                ppNtks[nStep+1][2*i+0] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( pTemp );
                ppNtks[nStep+1][2*i+1] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+1] );
                Kit_DsdNtkFree( pTemp );

                printf( "Cof%d%d: ", nStep+1, 2*i+0 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+0] ), printf( "\n" );
                printf( "Cof%d%d: ", nStep+1, 2*i+1 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+1] ), printf( "\n" );
            }
        }
    }

    // free the networks
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        if ( ppNtks[i][k] )
            Kit_DsdNtkFree( ppNtks[i][k] );
    ABC_FREE( ppCofs[0][0] );

    assert( nStep <= nLimit );
    return nStep;
}